

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *tree,CordRep *rep)

{
  bool owned;
  int depth_00;
  CordRepBtree *pCVar1;
  OpResult OVar2;
  OpResult result_00;
  OpResult result;
  CordRepBtree *leaf;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> ops;
  size_t length;
  int depth;
  CordRep *rep_local;
  CordRepBtree *tree_local;
  
  depth_00 = height(tree);
  ops.stack[0xb] = (CordRepBtree *)rep->length;
  pCVar1 = anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::BuildStack
                     ((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       *)&leaf,tree,depth_00);
  owned = anon_unknown_0::
          StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::owned
                    ((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                      *)&leaf,depth_00);
  OVar2 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                    (pCVar1,owned,rep,(size_t)ops.stack[0xb]);
  result_00._12_4_ = 0;
  result_00.tree = (CordRepBtree *)SUB128(OVar2._0_12_,0);
  result_00.action = SUB124(OVar2._0_12_,8);
  pCVar1 = anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::
           Unwind<false>((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                          *)&leaf,tree,depth_00,(size_t)ops.stack[0xb],result_00);
  return pCVar1;
}

Assistant:

CordRepBtree* CordRepBtree::AddCordRep(CordRepBtree* tree, CordRep* rep) {
  const int depth = tree->height();
  const size_t length = rep->length;
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);
  const OpResult result =
      leaf->AddEdge<edge_type>(ops.owned(depth), rep, length);
  return ops.Unwind(tree, depth, length, result);
}